

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O1

ParticleUpperBound * __thiscall
despot::DSPOMDP::CreateParticleUpperBound(DSPOMDP *this,string *name)

{
  int iVar1;
  TrivialParticleUpperBound *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unsupported base upper bound: ",0x1e);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"Supported types: TRIVIAL (default)");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
  }
  this_00 = (TrivialParticleUpperBound *)operator_new(0x10);
  TrivialParticleUpperBound::TrivialParticleUpperBound(this_00,this);
  return &this_00->super_ParticleUpperBound;
}

Assistant:

ParticleUpperBound* DSPOMDP::CreateParticleUpperBound(string name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported base upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL (default)" << endl;
		exit(1);
	}
}